

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O0

fsg_arciter_t * fsg_arciter_next(fsg_arciter_t *itor)

{
  hash_iter_t *phVar1;
  fsg_arciter_t *itor_local;
  
  if (itor->gn == (gnode_t *)0x0) {
    if (itor->null_itor == (hash_iter_t *)0x0) goto LAB_001051f0;
    phVar1 = hash_table_iter_next(itor->null_itor);
    itor->null_itor = phVar1;
    phVar1 = itor->null_itor;
  }
  else {
    itor->gn = itor->gn->next;
    if (itor->gn != (gnode_t *)0x0) {
      return itor;
    }
    phVar1 = hash_table_iter_next(itor->itor);
    itor->itor = phVar1;
    if (itor->itor != (hash_iter_t *)0x0) {
      itor->gn = (gnode_t *)itor->itor->ent->val;
      return itor;
    }
    phVar1 = itor->null_itor;
  }
  if (phVar1 != (hash_iter_t *)0x0) {
    return itor;
  }
LAB_001051f0:
  fsg_arciter_free(itor);
  return (fsg_arciter_t *)0x0;
}

Assistant:

fsg_arciter_t *
fsg_arciter_next(fsg_arciter_t * itor)
{
    /* Iterate over non-null arcs first. */
    if (itor->gn) {
        itor->gn = gnode_next(itor->gn);
        /* Move to the next destination arc. */
        if (itor->gn == NULL) {
            itor->itor = hash_table_iter_next(itor->itor);
            if (itor->itor != NULL)
                itor->gn = hash_entry_val(itor->itor->ent);
            else if (itor->null_itor == NULL)
                goto stop_iteration;
        }
    }
    else {
        if (itor->null_itor == NULL)
            goto stop_iteration;
        itor->null_itor = hash_table_iter_next(itor->null_itor);
        if (itor->null_itor == NULL)
            goto stop_iteration;
    }
    return itor;
  stop_iteration:
    fsg_arciter_free(itor);
    return NULL;

}